

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgException.h
# Opt level: O0

void __thiscall
TCLAP::CmdLineParseException::CmdLineParseException
          (CmdLineParseException *this,string *text,string *id)

{
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  ArgException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  allocator<char> local_f9;
  string local_f8 [39];
  allocator<char> local_d1;
  string local_d0 [55];
  undefined1 local_99 [33];
  string local_78 [32];
  string local_58 [32];
  string local_38 [56];
  
  this_00 = (ArgException *)local_99;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,(allocator<char> *)this_00)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,(allocator<char> *)this_00)
  ;
  std::operator+(in_stack_fffffffffffffed8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,(allocator<char> *)this_00)
  ;
  std::operator+(in_stack_fffffffffffffed8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,(allocator<char> *)this_00)
  ;
  std::operator+(in_stack_fffffffffffffed8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  ArgException::ArgException(this_00,in_RDX,in_RSI,in_RDI);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffee0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffedf);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::__cxx11::string::~string((string *)(local_99 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_99);
  *(undefined ***)in_RDI = &PTR__CmdLineParseException_00196860;
  return;
}

Assistant:

CmdLineParseException( const std::string& text = "undefined exception", 
					           const std::string& id = "undefined" )
			: ArgException( text, 
			                id,
							std::string( "Exception found when the values ") +
							std::string( "on the command line do not meet ") +
							std::string( "the requirements of the defined ") +
							std::string( "Args." ))
		{ }